

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Train.cpp
# Opt level: O2

vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_> * __thiscall
tiger::trains::world::Train::getPosibleCollisions
          (vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
           *__return_storage_ptr__,Train *this,MoveModel *move)

{
  World *pWVar1;
  pointer ppTVar2;
  pointer ppLVar3;
  Line *this_00;
  Train *pTVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  SpeedType SVar8;
  uint uVar9;
  Point *pPVar10;
  vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_> *pvVar11;
  __normal_iterator<tiger::trains::world::Line_**,_std::vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>_>
  _Var12;
  Point *pPVar13;
  Writer *pWVar14;
  vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_> *pvVar15;
  uint uVar16;
  pointer ppLVar17;
  pointer ppTVar18;
  Train *pTVar19;
  Line *local_d8;
  vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_> edges;
  Train *train;
  Level local_98;
  undefined4 uStack_94;
  char *local_90;
  LineNumber local_88;
  char *local_80;
  VerboseLevel local_78;
  Logger *local_70;
  bool local_68;
  Logger *local_60;
  char *local_58;
  DispatchAction local_50;
  pointer local_48;
  pointer pbStack_40;
  pointer local_38;
  
  iVar7 = this->position;
  local_d8 = this->line;
  if (move != (MoveModel *)0x0) {
    iVar5 = models::MoveModel::getLineIdx(move);
    iVar6 = Line::getIdx(local_d8);
    if (iVar5 != iVar6) {
      pPVar10 = getPoint(this);
      if (pPVar10 == (Point *)0x0) {
        train = (Train *)&PTR__Writer_0019ac58;
        local_98 = Error;
        local_90 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/BrychDaneel[P]WgForgeTrains/src/world/Train.cpp"
        ;
        local_88 = 0xc2;
        local_80 = 
        "std::vector<Train *> tiger::trains::world::Train::getPosibleCollisions(const models::MoveModel *)"
        ;
        local_78 = 0;
        local_70 = (Logger *)0x0;
        local_68 = false;
        local_60 = (Logger *)0x0;
        local_58 = "";
        local_50 = NormalLog;
        local_48 = (pointer)0x0;
        pbStack_40 = (pointer)0x0;
        local_38 = (pointer)0x0;
        pWVar14 = el::base::Writer::construct((Writer *)&train,1,"default");
        el::base::Writer::operator<<(pWVar14,(char (*) [34])"Bad move command for predictions.");
        goto LAB_00162797;
      }
      pPVar10 = getPoint(this);
      pvVar11 = Point::getEdges(pPVar10);
      std::vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>::
      vector(&edges,pvVar11);
      ppLVar3 = edges.
                super__Vector_base<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      ppLVar17 = edges.
                 super__Vector_base<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pWVar1 = this->owner;
      iVar5 = models::MoveModel::getLineIdx(move);
      train = (Train *)World::getLineByIdx(pWVar1,iVar5);
      _Var12 = std::
               __find_if<__gnu_cxx::__normal_iterator<tiger::trains::world::Line**,std::vector<tiger::trains::world::Line*,std::allocator<tiger::trains::world::Line*>>>,__gnu_cxx::__ops::_Iter_equals_val<tiger::trains::world::Line*const>>
                         (ppLVar17,ppLVar3);
      if (_Var12._M_current ==
          edges.
          super__Vector_base<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        train = (Train *)&PTR__Writer_0019ac58;
        local_98 = Error;
        local_90 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/BrychDaneel[P]WgForgeTrains/src/world/Train.cpp"
        ;
        local_88 = 0xca;
        local_80 = 
        "std::vector<Train *> tiger::trains::world::Train::getPosibleCollisions(const models::MoveModel *)"
        ;
        local_78 = 0;
        local_70 = (Logger *)0x0;
        local_68 = false;
        local_60 = (Logger *)0x0;
        local_58 = "";
        local_50 = NormalLog;
        local_48 = (pointer)0x0;
        pbStack_40 = (pointer)0x0;
        local_38 = (pointer)0x0;
        pWVar14 = el::base::Writer::construct((Writer *)&train,1,"default");
        el::base::Writer::operator<<(pWVar14,(char (*) [34])"Bad move command for predictions.");
        el::base::Writer::~Writer((Writer *)&train);
        (__return_storage_ptr__->
        super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
        )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->
        super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
        )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->
        super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      }
      else {
        pWVar1 = this->owner;
        iVar7 = models::MoveModel::getLineIdx(move);
        local_d8 = World::getLineByIdx(pWVar1,iVar7);
        pPVar10 = Line::getStartPont(local_d8);
        pPVar13 = getPoint(this);
        if (pPVar10 == pPVar13) {
          iVar7 = 0;
        }
        else {
          iVar7 = Line::getLenght(local_d8);
        }
      }
      std::_Vector_base<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
      ::~_Vector_base(&edges.
                       super__Vector_base<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
                     );
      if (_Var12._M_current ==
          edges.
          super__Vector_base<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        return __return_storage_ptr__;
      }
    }
    SVar8 = models::MoveModel::getSpeedType(move);
    if (SVar8 == FORWARD) {
      iVar5 = Line::getLenght(local_d8);
      if (iVar7 == iVar5) {
        train = (Train *)&PTR__Writer_0019ac58;
        local_98 = Error;
        local_90 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/BrychDaneel[P]WgForgeTrains/src/world/Train.cpp"
        ;
        local_88 = 0xd6;
        local_80 = 
        "std::vector<Train *> tiger::trains::world::Train::getPosibleCollisions(const models::MoveModel *)"
        ;
        local_78 = 0;
        local_70 = (Logger *)0x0;
        local_68 = false;
        local_60 = (Logger *)0x0;
        local_58 = "";
        local_50 = NormalLog;
        local_48 = (pointer)0x0;
        pbStack_40 = (pointer)0x0;
        local_38 = (pointer)0x0;
        pWVar14 = el::base::Writer::construct((Writer *)&train,1,"default");
        el::base::Writer::operator<<(pWVar14,(char (*) [34])"Bad move command for predictions.");
        goto LAB_00162797;
      }
      iVar7 = iVar7 + 1;
    }
    SVar8 = models::MoveModel::getSpeedType(move);
    if (SVar8 == REVERSE) {
      if (iVar7 == 0) {
        train = (Train *)&PTR__Writer_0019ac58;
        local_98 = Error;
        local_90 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/BrychDaneel[P]WgForgeTrains/src/world/Train.cpp"
        ;
        local_88 = 0xe1;
        local_80 = 
        "std::vector<Train *> tiger::trains::world::Train::getPosibleCollisions(const models::MoveModel *)"
        ;
        local_78 = 0;
        local_70 = (Logger *)0x0;
        local_68 = false;
        local_60 = (Logger *)0x0;
        local_58 = "";
        local_50 = NormalLog;
        local_48 = (pointer)0x0;
        pbStack_40 = (pointer)0x0;
        local_38 = (pointer)0x0;
        pWVar14 = el::base::Writer::construct((Writer *)&train,1,"default");
        el::base::Writer::operator<<(pWVar14,(char (*) [34])"Bad move command for predictions.");
LAB_00162797:
        el::base::Writer::~Writer((Writer *)&train);
        (__return_storage_ptr__->
        super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
        )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->
        super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
        )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->
        super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        return __return_storage_ptr__;
      }
      iVar7 = iVar7 + -1;
    }
  }
  (__return_storage_ptr__->
  super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>)
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>)
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>)
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar15 = Line::getTrains(this->line);
  ppTVar2 = (pvVar15->
            super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  for (ppTVar18 = (pvVar15->
                  super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
                  )._M_impl.super__Vector_impl_data._M_start; ppTVar18 != ppTVar2;
      ppTVar18 = ppTVar18 + 1) {
    train = *ppTVar18;
    if (train != this) {
      uVar16 = iVar7 - train->position;
      uVar9 = -uVar16;
      if (0 < (int)uVar16) {
        uVar9 = uVar16;
      }
      if (uVar9 < 2) {
        std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>::
        push_back(__return_storage_ptr__,&train);
      }
    }
  }
  if (iVar7 == 0) {
    pPVar10 = Line::getStartPont(local_d8);
  }
  else {
    pPVar10 = (Point *)0x0;
  }
  iVar5 = Line::getLenght(local_d8);
  if (iVar7 == iVar5) {
    pPVar10 = Line::getStartPont(local_d8);
  }
  if (pPVar10 != (Point *)0x0) {
    pvVar11 = Point::getEdges(pPVar10);
    ppLVar3 = (pvVar11->
              super__Vector_base<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    for (ppLVar17 = (pvVar11->
                    super__Vector_base<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
                    )._M_impl.super__Vector_impl_data._M_start; ppLVar17 != ppLVar3;
        ppLVar17 = ppLVar17 + 1) {
      this_00 = *ppLVar17;
      pvVar15 = Line::getTrains(this_00);
      ppTVar2 = (pvVar15->
                super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      for (ppTVar18 = (pvVar15->
                      super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
                      )._M_impl.super__Vector_impl_data._M_start; ppTVar18 != ppTVar2;
          ppTVar18 = ppTVar18 + 1) {
        train = *ppTVar18;
        pPVar13 = Line::getStartPont(this_00);
        if ((pPVar13 == pPVar10) && (train->position < 2)) {
          std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
          ::push_back(__return_storage_ptr__,&train);
        }
        pPVar13 = Line::getEndPont(this_00);
        if ((pPVar13 == pPVar10) &&
           (iVar5 = train->position, iVar6 = Line::getLenght(this_00), iVar6 + -2 < iVar5)) {
          std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
          ::push_back(__return_storage_ptr__,&train);
        }
      }
    }
  }
  if (iVar7 < 2) {
    pPVar10 = Line::getStartPont(local_d8);
    Point::getTrains((vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
                      *)&train,pPVar10);
    pTVar4 = (Train *)CONCAT44(uStack_94,local_98);
    for (pTVar19 = train; pTVar19 != pTVar4; pTVar19 = (Train *)&pTVar19->idx) {
      edges.
      super__Vector_base<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)(pTVar19->super_IUpgradeble)._vptr_IUpgradeble;
      std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>::
      push_back(__return_storage_ptr__,(value_type *)&edges);
    }
    std::_Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
    ::~_Vector_base((_Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
                     *)&train);
  }
  iVar5 = Line::getLenght(local_d8);
  if (iVar5 + -2 < iVar7) {
    pPVar10 = Line::getEndPont(local_d8);
    Point::getTrains((vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
                      *)&train,pPVar10);
    pTVar4 = (Train *)CONCAT44(uStack_94,local_98);
    for (pTVar19 = train; pTVar19 != pTVar4; pTVar19 = (Train *)&pTVar19->idx) {
      edges.
      super__Vector_base<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)(pTVar19->super_IUpgradeble)._vptr_IUpgradeble;
      std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>::
      push_back(__return_storage_ptr__,(value_type *)&edges);
    }
    std::_Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
    ::~_Vector_base((_Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
                     *)&train);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Train *> Train::getPosibleCollisions(const models::MoveModel *move)
{
    int pos = position;
    const Line *lin = line;


    if (move!=nullptr)
    {
        if (move->getLineIdx() != lin->getIdx())
        {

            if (getPoint() == nullptr)
            {
                LOG(ERROR) << "Bad move command for predictions.";
                return std::vector<Train *>();
            }

            std::vector<Line *> edges = getPoint()->getEdges();

            if (std::find(edges.begin(), edges.end(), owner->getLineByIdx(move->getLineIdx())) == edges.end())
            {
                LOG(ERROR) << "Bad move command for predictions.";
                return std::vector<Train *>();
            }

            lin = owner->getLineByIdx(move->getLineIdx());
            pos = lin->getStartPont() == getPoint() ? 0 : lin->getLenght();
        }

        if (move->getSpeedType() == models::SpeedType::FORWARD)
        {
            if (pos == lin->getLenght())
            {
                LOG(ERROR) << "Bad move command for predictions.";
                return std::vector<Train *>();
            }

            pos++;
        }

        if (move->getSpeedType() == models::SpeedType::REVERSE)
        {
            if (pos == 0)
            {
                LOG(ERROR) << "Bad move command for predictions.";
                return std::vector<Train *>();
            }

            pos--;
        }
    }

    std::vector<Train *> res;

    for (Train *train : line->getTrains())
        if (train != this)
        {
            if (abs(pos - train->getPosition()) < 2)
                res.push_back(train);
        }

    Point *point = nullptr;

    if (pos == 0)
        point = lin->getStartPont();

    if (pos == lin->getLenght())
        point = lin->getStartPont();

    if (point)
        for (Line *edg: point->getEdges())
            for (Train *train : edg->getTrains())
            {
                if (edg->getStartPont() == point && train->getPosition() < 2)
                    res.push_back(train);

                if (edg->getEndPont() == point && train->getPosition() > edg->getLenght() - 2)
                    res.push_back(train);
            }

    if (pos < 2)
        for (Train *train : lin->getStartPont()->getTrains())
            res.push_back(train);

    if (pos > lin->getLenght() - 2)
        for (Train *train : lin->getEndPont()->getTrains())
            res.push_back(train);

    return res;
}